

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber *
BigNumber::unsignedMax(BigNumber *__return_storage_ptr__,BigNumber *num1,BigNumber *num2)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  size_t local_28;
  size_t index;
  BigNumber *num2_local;
  BigNumber *num1_local;
  
  if (num2->numOfDigits < num1->numOfDigits) {
    BigNumber(__return_storage_ptr__,num1);
  }
  else if (num1->numOfDigits < num2->numOfDigits) {
    BigNumber(__return_storage_ptr__,num2);
  }
  else {
    local_28 = (size_t)(num1->numOfDigits - 1);
    while( true ) {
      iVar2 = operator[](num1,local_28);
      iVar3 = operator[](num2,local_28);
      if (iVar2 != iVar3 || local_28 == 0) break;
      local_28 = local_28 - 1;
    }
    iVar2 = operator[](num1,local_28);
    iVar3 = operator[](num2,local_28);
    if (iVar2 < iVar3) {
      iVar2 = operator[](num1,local_28);
      iVar3 = operator[](num2,local_28);
      if (iVar3 <= iVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      BigNumber(__return_storage_ptr__,num2);
    }
    else {
      BigNumber(__return_storage_ptr__,num1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::unsignedMax(const BigNumber &num1, const BigNumber &num2) {
    if( num1.numOfDigits > num2.numOfDigits){
        return num1;
    }

    if( num1.numOfDigits < num2.numOfDigits){
        return num2;
    }

    size_t index = num1.numOfDigits - 1;
    while( (num1[index] == num2[index]) && (index > 0) ){
        --index;
    }
    if( num1[index] >= num2[index]){
        return num1;
    }
    if( num1[index] < num2[index]){
        return num2;
    }
}